

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O0

char * TextToPascal(char *text)

{
  int iVar1;
  int local_18;
  int local_14;
  int j;
  int i;
  char *text_local;
  
  iVar1 = toupper((int)*text);
  TextToPascal::buffer[0] = (char)iVar1;
  local_14 = 1;
  local_18 = 1;
  while( true ) {
    if (0x3ff < local_14) {
      return TextToPascal::buffer;
    }
    if (text[local_18] == '\0') break;
    if (text[local_18] == '_') {
      local_18 = local_18 + 1;
      iVar1 = toupper((int)text[local_18]);
      TextToPascal::buffer[local_14] = (char)iVar1;
    }
    else {
      TextToPascal::buffer[local_14] = text[local_18];
    }
    local_14 = local_14 + 1;
    local_18 = local_18 + 1;
  }
  TextToPascal::buffer[local_14] = '\0';
  return TextToPascal::buffer;
}

Assistant:

const char *TextToPascal(const char *text)
{
    static char buffer[MAX_TEXT_BUFFER_LENGTH] = { 0 };

    buffer[0] = (char)toupper(text[0]);

    for (int i = 1, j = 1; i < MAX_TEXT_BUFFER_LENGTH; i++, j++)
    {
        if (text[j] != '\0')
        {
            if (text[j] != '_') buffer[i] = text[j];
            else
            {
                j++;
                buffer[i] = (char)toupper(text[j]);
            }
        }
        else { buffer[i] = '\0'; break; }
    }

    return buffer;
}